

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubStruct
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  pointer pHVar1;
  uint32_t uVar2;
  value_type *pvVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_48;
  
  uVar2 = Random::upTo(this->rand,8);
  if (uVar2 == 1) {
    this = (HeapTypeGeneratorImpl *)((ulong)(share == Shared) * 4 + 0x58);
  }
  else if (uVar2 == 0) {
    this = (HeapTypeGeneratorImpl *)((ulong)(share == Shared) * 4 + 0x38);
  }
  else {
    getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
              (&local_48,this,share);
    pHVar1 = local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this->rand,&local_48);
      this = (HeapTypeGeneratorImpl *)pvVar3->id;
    }
    if (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_finish == pHVar1) {
      this = (HeapTypeGeneratorImpl *)
             ((ulong)((uint)((uVar2 & 1) == 0) * 0x20 + (uint)(share == Shared) * 4) + 0x38);
    }
  }
  return (HeapType)(uintptr_t)this;
}

Assistant:

HeapType pickSubStruct(Shareability share) {
    auto choice = rand.upTo(8);
    switch (choice) {
      case 0:
        return HeapTypes::struct_.getBasic(share);
      case 1:
        return HeapTypes::none.getBasic(share);
      default: {
        if (auto type = pickKind<StructKind>(share)) {
          return *type;
        }
        HeapType ht = (choice % 2) ? HeapType::struct_ : HeapType::none;
        return ht.getBasic(share);
      }
    }
  }